

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase694::run(TestCase694 *this)

{
  StructDataBitCount *this_00;
  initializer_list<unsigned_int> init;
  bool bVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  size_t sVar3;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar4;
  Builder local_238;
  bool local_219;
  undefined1 local_218 [7];
  bool _kj_shouldLog_2;
  bool local_1f9;
  undefined1 local_1f8 [7];
  bool _kj_shouldLog_1;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_1d8;
  size_t local_1c8;
  uint local_1c0;
  bool local_1b9;
  undefined1 auStack_1b8 [7];
  bool _kj_shouldLog;
  size_t local_1b0;
  ArrayPtr<const_char> local_1a8;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_198;
  word *local_188;
  word *zerosEnd;
  undefined4 local_178;
  undefined4 local_174;
  iterator local_170;
  undefined8 local_168;
  ArrayPtr<const_unsigned_int> local_160;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_150;
  word *local_140;
  word *zerosStart;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase694 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  local_150 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[](&local_150,0);
  local_140 = kj::ArrayPtr<const_capnp::word>::end(pAVar2);
  zerosEnd._4_4_ = 0xc;
  local_178 = 0x22;
  local_174 = 0x38;
  local_170 = (iterator)((long)&zerosEnd + 4);
  local_168 = 3;
  init._M_len = 3;
  init._M_array = local_170;
  kj::ArrayPtr<const_unsigned_int>::ArrayPtr(&local_160,init);
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt32List((Builder *)local_128,local_160);
  local_198 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[](&local_198,0);
  local_188 = kj::ArrayPtr<const_capnp::word>::end(pAVar2);
  Text::Reader::Reader((Reader *)&local_1a8,"foo");
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField
            ((Builder *)local_128,(Reader)local_1a8);
  _auStack_1b8 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  sVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_1b8);
  if (sVar3 != 1) {
    local_1b9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1b9 != false) {
      local_1c0 = 1;
      AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
      local_1d8 = AVar4;
      local_1c8 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size(&local_1d8);
      kj::_::Debug::log<char_const(&)[65],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x2c0,ERROR,
                 "\"failed: expected \" \"(1u) == (builder.getSegmentsForOutput().size())\", 1u, builder.getSegmentsForOutput().size()"
                 ,(char (*) [65])"failed: expected (1u) == (builder.getSegmentsForOutput().size())",
                 &local_1c0,&local_1c8);
      local_1b9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::disownUInt32List
            ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_1f8,(Builder *)local_128);
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::~Orphan
            ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_1f8);
  bVar1 = allZero(local_140,local_188);
  if (!bVar1) {
    local_1f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1f9 != false) {
      kj::_::Debug::log<char_const(&)[47]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x2c4,ERROR,"\"failed: expected \" \"allZero(zerosStart, zerosEnd)\"",
                 (char (*) [47])"failed: expected allZero(zerosStart, zerosEnd)");
      local_1f9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
            ((Builder *)local_218,(Builder *)local_128);
  bVar1 = capnp::operator==("foo",(Builder *)local_218);
  if (!bVar1) {
    local_219 = kj::_::Debug::shouldLog(ERROR);
    while (local_219 != false) {
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
                (&local_238,(Builder *)local_128);
      kj::_::Debug::log<char_const(&)[50],char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x2c6,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (root.getTextField())\", \"foo\", root.getTextField()"
                 ,(char (*) [50])"failed: expected (\"foo\") == (root.getTextField())",
                 (char (*) [4])"foo",&local_238);
      local_219 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Orphans, ListsZerodAfterUse) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  const word* zerosStart = builder.getSegmentsForOutput()[0].end();
  root.setUInt32List({12, 34, 56});
  const word* zerosEnd = builder.getSegmentsForOutput()[0].end();

  root.setTextField("foo");  // guard against overruns

  EXPECT_EQ(1u, builder.getSegmentsForOutput().size());  // otherwise test is invalid

  root.disownUInt32List();

  EXPECT_TRUE(allZero(zerosStart, zerosEnd));

  EXPECT_EQ("foo", root.getTextField());
}